

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebra.cpp
# Opt level: O2

void __thiscall lsim::Transform::rotate(Transform *this,float degrees)

{
  float fVar1;
  float afVar2 [2];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar5 = (degrees * 3.1415927) / 180.0;
  fVar6 = sinf(fVar5);
  fVar7 = cosf(fVar5);
  fVar3 = this->m_el[0][0];
  fVar4 = this->m_el[0][1];
  fVar8 = -fVar6;
  fVar5 = this->m_el[1][1];
  fVar1 = this->m_el[1][0];
  this->m_el[0][0] = fVar3 * fVar7 + fVar8 * fVar4;
  this->m_el[0][1] = fVar3 * fVar6 + fVar7 * fVar4;
  this->m_el[1][0] = fVar1 * fVar7 + fVar8 * fVar5;
  this->m_el[1][1] = fVar1 * fVar6 + fVar7 * fVar5;
  fVar5 = this->m_el[2][1];
  fVar1 = this->m_el[2][0];
  afVar2[1] = fVar1 * fVar6 + fVar5 * fVar7;
  afVar2[0] = fVar1 * fVar7 + fVar5 * fVar8;
  this->m_el[2] = afVar2;
  return;
}

Assistant:

void Transform::rotate(float degrees) {
	const float rad = deg2rad(degrees);
	const float sa = sinf(rad);
	const float ca = cosf(rad);
	const Transform cur(*this);

	m_el[0][0] = ca * cur.m_el[0][0] - sa * cur.m_el[0][1];
	m_el[1][0] = ca * cur.m_el[1][0] - sa * cur.m_el[1][1];
	m_el[2][0] = ca * cur.m_el[2][0] - sa * cur.m_el[2][1];

	m_el[0][1] = sa * cur.m_el[0][0] + ca * cur.m_el[0][1];
	m_el[1][1] = sa * cur.m_el[1][0] + ca * cur.m_el[1][1];
	m_el[2][1] = sa * cur.m_el[2][0] + ca * cur.m_el[2][1];
}